

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_protocol_options.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::PixieProtocolOptions::GetProtocolSignature_abi_cxx11_
          (string *__return_storage_ptr__,PixieProtocolOptions *this)

{
  ostream *poVar1;
  rep rVar2;
  stringstream local_1a0 [8];
  stringstream signature;
  ostream local_190 [376];
  PixieProtocolOptions *local_18;
  PixieProtocolOptions *this_local;
  string *ret;
  
  local_18 = this;
  this_local = (PixieProtocolOptions *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"pixie://localhost?version=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->version_);
  poVar1 = std::operator<<(poVar1,"&heartbeat=");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&this->heartbeat_interval_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,rVar2 / 1000);
  poVar1 = std::operator<<(poVar1,"&idle=");
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&this->idle_);
  std::ostream::operator<<(poVar1,rVar2 / 1000);
  if (this->minti_ != 0) {
    poVar1 = std::operator<<(local_190,"&minti=");
    std::ostream::operator<<(poVar1,this->minti_);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string PixieProtocolOptions::GetProtocolSignature() const
{
    std::stringstream signature;
    signature << "pixie://localhost?version=" << version_ << "&heartbeat=" << heartbeat_interval_.count() / 1000 << "&idle=" << idle_.count() / 1000;

    if (minti_ != 0)
    {
        signature << "&minti=" << minti_;
    }

    std::string ret = signature.str();

    return ret;
}